

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  watcher_list *pwVar3;
  watcher_list *pwVar4;
  long *plVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  watcher_list *pwVar9;
  size_t sVar10;
  void **ppvVar11;
  watcher_list *pwVar12;
  watcher_list *pwVar13;
  bool bVar14;
  void **ppvVar15;
  watcher_list *pwVar16;
  watcher_list *pwVar17;
  
  if ((handle->flags & 0x4000) == 0) {
    loop = handle->loop;
    iVar6 = loop->inotify_fd;
    if (iVar6 == -1) {
      iVar6 = uv__inotify_init1(0x80800);
      if (iVar6 == -1) {
        piVar8 = __errno_location();
        if (*piVar8 == 0x26) {
          iVar6 = uv__inotify_init();
          if (iVar6 == -1) {
            iVar6 = -*piVar8;
          }
          else {
            iVar7 = uv__cloexec_ioctl(iVar6,1);
            if ((iVar7 != 0) || (iVar7 = uv__nonblock_ioctl(iVar6,1), iVar7 != 0)) {
              uv__close(iVar6);
              iVar6 = iVar7;
            }
          }
        }
        else {
          iVar6 = -*piVar8;
        }
      }
      if (iVar6 < 0) {
        return iVar6;
      }
      loop->inotify_fd = iVar6;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar6);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
      iVar6 = handle->loop->inotify_fd;
    }
    iVar6 = uv__inotify_add_watch(iVar6,path,0xfc6);
    if (iVar6 == -1) {
      piVar8 = __errno_location();
      iVar6 = -*piVar8;
    }
    else {
      pwVar9 = find_watcher(handle->loop,iVar6);
      if (pwVar9 == (watcher_list *)0x0) {
        sVar10 = strlen(path);
        pwVar9 = (watcher_list *)uv__malloc(sVar10 + 0x49);
        if (pwVar9 == (watcher_list *)0x0) {
          return -0xc;
        }
        pwVar9->wd = iVar6;
        strcpy((char *)(pwVar9 + 1),path);
        pwVar9->path = (char *)(pwVar9 + 1);
        pwVar9->watchers[0] = pwVar9->watchers;
        pwVar9->watchers[1] = pwVar9->watchers;
        pwVar9->iterating = 0;
        ppvVar11 = &handle->loop->inotify_watchers;
        bVar14 = false;
        pwVar12 = (watcher_list *)0x0;
        pwVar16 = (watcher_list *)ppvVar11;
        while (pwVar16 = (pwVar16->entry).rbe_left, pwVar16 != (watcher_list *)0x0) {
          iVar7 = pwVar16->wd;
          bVar14 = iVar6 < iVar7;
          pwVar12 = pwVar16;
          if (iVar7 <= iVar6) {
            if (iVar6 <= iVar7) goto LAB_004e9533;
            pwVar16 = (watcher_list *)&(pwVar16->entry).rbe_right;
          }
        }
        (pwVar9->entry).rbe_parent = pwVar12;
        (pwVar9->entry).rbe_left = (watcher_list *)0x0;
        (pwVar9->entry).rbe_right = (watcher_list *)0x0;
        (pwVar9->entry).rbe_color = 1;
        ppvVar15 = pwVar12->watchers + ((ulong)((byte)~bVar14 & 1) - 4);
        if (pwVar12 == (watcher_list *)0x0) {
          ppvVar15 = ppvVar11;
        }
        *ppvVar15 = pwVar9;
        pwVar16 = pwVar9;
        while ((pwVar12 != (watcher_list *)0x0 && ((pwVar12->entry).rbe_color == 1))) {
          pwVar3 = (pwVar12->entry).rbe_parent;
          pwVar17 = (pwVar3->entry).rbe_left;
          pwVar13 = pwVar16;
          if (pwVar12 == pwVar17) {
            pwVar4 = (pwVar3->entry).rbe_right;
            if ((pwVar4 != (watcher_list *)0x0) && ((pwVar4->entry).rbe_color == 1)) {
              (pwVar4->entry).rbe_color = 0;
              goto LAB_004e93d6;
            }
            pwVar4 = (pwVar12->entry).rbe_right;
            if (pwVar4 == pwVar16) {
              pwVar17 = (pwVar4->entry).rbe_left;
              (pwVar12->entry).rbe_right = pwVar17;
              if (pwVar17 == (watcher_list *)0x0) {
                (pwVar4->entry).rbe_parent = pwVar3;
                pwVar17 = (pwVar12->entry).rbe_parent;
LAB_004e94bd:
                ppvVar15 = pwVar17->watchers + ((ulong)(pwVar12 != (pwVar17->entry).rbe_left) - 4);
              }
              else {
                (pwVar17->entry).rbe_parent = pwVar12;
                pwVar17 = (pwVar12->entry).rbe_parent;
                (pwVar4->entry).rbe_parent = pwVar17;
                ppvVar15 = ppvVar11;
                if (pwVar17 != (watcher_list *)0x0) goto LAB_004e94bd;
              }
              *ppvVar15 = pwVar4;
              (pwVar4->entry).rbe_left = pwVar12;
              (pwVar12->entry).rbe_parent = pwVar4;
              pwVar17 = (pwVar3->entry).rbe_left;
              pwVar13 = pwVar12;
              pwVar12 = pwVar16;
            }
            (pwVar12->entry).rbe_color = 0;
            (pwVar3->entry).rbe_color = 1;
            pwVar16 = (pwVar17->entry).rbe_right;
            (pwVar3->entry).rbe_left = pwVar16;
            if (pwVar16 != (watcher_list *)0x0) {
              (pwVar16->entry).rbe_parent = pwVar3;
            }
            pwVar16 = (pwVar3->entry).rbe_parent;
            (pwVar17->entry).rbe_parent = pwVar16;
            ppvVar15 = ppvVar11;
            if (pwVar16 != (watcher_list *)0x0) {
              ppvVar15 = pwVar16->watchers + ((ulong)(pwVar3 != (pwVar16->entry).rbe_left) - 4);
            }
            *ppvVar15 = pwVar17;
            (pwVar17->entry).rbe_right = pwVar3;
            (pwVar3->entry).rbe_parent = pwVar17;
          }
          else if ((pwVar17 == (watcher_list *)0x0) || ((pwVar17->entry).rbe_color != 1)) {
            pwVar17 = (pwVar12->entry).rbe_left;
            if (pwVar17 == pwVar16) {
              pwVar13 = (pwVar17->entry).rbe_right;
              (pwVar12->entry).rbe_left = pwVar13;
              if (pwVar13 == (watcher_list *)0x0) {
                (pwVar17->entry).rbe_parent = pwVar3;
                pwVar13 = (pwVar12->entry).rbe_parent;
LAB_004e9450:
                ppvVar15 = pwVar13->watchers + ((ulong)(pwVar12 != (pwVar13->entry).rbe_left) - 4);
              }
              else {
                (pwVar13->entry).rbe_parent = pwVar12;
                pwVar13 = (pwVar12->entry).rbe_parent;
                (pwVar17->entry).rbe_parent = pwVar13;
                ppvVar15 = ppvVar11;
                if (pwVar13 != (watcher_list *)0x0) goto LAB_004e9450;
              }
              *ppvVar15 = pwVar17;
              (pwVar17->entry).rbe_right = pwVar12;
              (pwVar12->entry).rbe_parent = pwVar17;
              pwVar13 = pwVar12;
              pwVar12 = pwVar16;
            }
            (pwVar12->entry).rbe_color = 0;
            (pwVar3->entry).rbe_color = 1;
            pwVar16 = (pwVar3->entry).rbe_right;
            pwVar12 = (pwVar16->entry).rbe_left;
            (pwVar3->entry).rbe_right = pwVar12;
            if (pwVar12 != (watcher_list *)0x0) {
              (pwVar12->entry).rbe_parent = pwVar3;
            }
            pwVar12 = (pwVar3->entry).rbe_parent;
            (pwVar16->entry).rbe_parent = pwVar12;
            ppvVar15 = ppvVar11;
            if (pwVar12 != (watcher_list *)0x0) {
              ppvVar15 = pwVar12->watchers + ((ulong)(pwVar3 != (pwVar12->entry).rbe_left) - 4);
            }
            *ppvVar15 = pwVar16;
            (pwVar16->entry).rbe_left = pwVar3;
            (pwVar3->entry).rbe_parent = pwVar16;
          }
          else {
            (pwVar17->entry).rbe_color = 0;
LAB_004e93d6:
            (pwVar12->entry).rbe_color = 0;
            (pwVar3->entry).rbe_color = 1;
            pwVar13 = pwVar3;
          }
          pwVar16 = pwVar13;
          pwVar12 = (pwVar13->entry).rbe_parent;
        }
        *(undefined4 *)((long)*ppvVar11 + 0x18) = 0;
      }
LAB_004e9533:
      uVar2 = handle->flags;
      if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
        puVar1 = &handle->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
      handle->watchers[0] = pwVar9->watchers;
      plVar5 = (long *)pwVar9->watchers[1];
      handle->watchers[1] = plVar5;
      *plVar5 = (long)handle->watchers;
      pwVar9->watchers[1] = handle->watchers;
      handle->path = pwVar9->path;
      handle->cb = cb;
      handle->wd = iVar6;
      iVar6 = 0;
    }
  }
  else {
    iVar6 = -0x16;
  }
  return iVar6;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return -EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = UV__IN_ATTRIB
         | UV__IN_CREATE
         | UV__IN_MODIFY
         | UV__IN_DELETE
         | UV__IN_DELETE_SELF
         | UV__IN_MOVE_SELF
         | UV__IN_MOVED_FROM
         | UV__IN_MOVED_TO;

  wd = uv__inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return -errno;

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  w = uv__malloc(sizeof(*w) + strlen(path) + 1);
  if (w == NULL)
    return -ENOMEM;

  w->wd = wd;
  w->path = strcpy((char*)(w + 1), path);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}